

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *
deqp::gles31::Functional::anon_unknown_1::TextureTraits<glu::Texture2D>::
createTextureFromCompressedData
          (MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *__return_storage_ptr__,
          RenderContext *renderCtx,ContextInfo *ctxInfo,CompressedTexture *compressedLevel,
          TexDecompressionParams *decompressionParams)

{
  Texture2D *this;
  DefaultDeleter<glu::Texture2D> local_3d [13];
  TexDecompressionParams *local_30;
  TexDecompressionParams *decompressionParams_local;
  CompressedTexture *compressedLevel_local;
  ContextInfo *ctxInfo_local;
  RenderContext *renderCtx_local;
  
  local_30 = decompressionParams;
  decompressionParams_local = (TexDecompressionParams *)compressedLevel;
  compressedLevel_local = (CompressedTexture *)ctxInfo;
  ctxInfo_local = (ContextInfo *)renderCtx;
  renderCtx_local = (RenderContext *)__return_storage_ptr__;
  this = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this,(RenderContext *)ctxInfo_local,(ContextInfo *)compressedLevel_local,1,
             (CompressedTexture *)decompressionParams_local,local_30);
  de::DefaultDeleter<glu::Texture2D>::DefaultDeleter(local_3d);
  de::details::MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::MovePtr
            (__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

static de::MovePtr<glu::Texture2D> createTextureFromCompressedData (glu::RenderContext&					renderCtx,
																		const glu::ContextInfo&				ctxInfo,
																		const tcu::CompressedTexture&		compressedLevel,
																		const tcu::TexDecompressionParams&	decompressionParams)
	{
		return de::MovePtr<glu::Texture2D>(new glu::Texture2D(renderCtx,
															  ctxInfo,
															  1,
															  &compressedLevel,
															  decompressionParams));
	}